

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linear-execution.h
# Opt level: O3

void wasm::
     LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
     ::scan(ModAsyncify<true,_false,_true> *self,Expression **currp)

{
  Id IVar1;
  Expression *pEVar2;
  char *__function;
  Expression *pEVar3;
  LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
  *pLVar4;
  code *pcVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  _func_void_ModAsyncify<true,_false,_true>_ptr_Expression_ptr_ptr *local_40;
  Expression *local_38;
  
  pEVar2 = *currp;
  IVar1 = pEVar2->_id;
  if ((int)IVar1 < 0x13) {
    switch(IVar1) {
    case InvalidId:
      handle_unreachable("bad id",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/linear-execution.h"
                         ,0x34);
    case BlockId:
      pLVar4 = &(self->
                super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>_>
                ).
                super_LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
      ;
      Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
      ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                  *)pLVar4,
                 Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                 ::doVisitBlock,currp);
      if ((pEVar2->_id == BlockId) &&
         ((pEVar2[1].type.id == 0 ||
          (Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
           ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                       *)pLVar4,ModAsyncify<true,_false,_true>::doNoteNonLinear,currp),
          pEVar2->_id == BlockId)))) {
        uVar6 = (uint)pEVar2[2].type.id;
        if ((int)uVar6 < 1) {
          return;
        }
        uVar7 = (ulong)(uVar6 & 0x7fffffff);
        lVar8 = uVar7 * 8;
        uVar7 = uVar7 + 1;
        while (lVar8 = lVar8 + -8, uVar7 - 2 < pEVar2[2].type.id) {
          Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
          ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                      *)pLVar4,scan,(Expression **)(*(long *)(pEVar2 + 2) + lVar8));
          uVar7 = uVar7 - 1;
          if (uVar7 < 2) {
            return;
          }
        }
LAB_0066889e:
        __assert_fail("index < usedElements",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/mixed_arena.h"
                      ,0xbc,
                      "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                     );
      }
      __function = "T *wasm::Expression::cast() [T = wasm::Block]";
      break;
    case IfId:
      pLVar4 = &(self->
                super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>_>
                ).
                super_LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
      ;
      Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
      ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                  *)pLVar4,
                 Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                 ::doVisitIf,currp);
      Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
      ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                  *)pLVar4,ModAsyncify<true,_false,_true>::doNoteNonLinear,currp);
      if (pEVar2->_id == IfId) {
        local_38 = pEVar2 + 2;
        local_40 = scan;
        if (*(long *)(pEVar2 + 2) != 0) {
          SmallVector<wasm::Walker<wasm::ModAsyncify<true,false,true>,wasm::Visitor<wasm::ModAsyncify<true,false,true>,void>>::Task,10ul>
          ::
          emplace_back<void(*&)(wasm::ModAsyncify<true,false,true>*,wasm::Expression**),wasm::Expression**&>
                    ((SmallVector<wasm::Walker<wasm::ModAsyncify<true,false,true>,wasm::Visitor<wasm::ModAsyncify<true,false,true>,void>>::Task,10ul>
                      *)&(self->
                         super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>_>
                         ).
                         super_LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                         .
                         super_PostWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                         .
                         super_Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                         .stack,&local_40,(Expression ***)&local_38);
        }
        Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
        ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                    *)pLVar4,ModAsyncify<true,_false,_true>::doNoteNonLinear,currp);
        if (pEVar2->_id == IfId) {
          Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
          ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                      *)pLVar4,scan,(Expression **)&pEVar2[1].type);
          Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
          ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                      *)pLVar4,ModAsyncify<true,_false,_true>::doNoteNonLinear,currp);
          if (pEVar2->_id == IfId) {
            Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
            ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                        *)pLVar4,scan,(Expression **)(pEVar2 + 1));
            return;
          }
        }
      }
      __function = "T *wasm::Expression::cast() [T = wasm::If]";
      break;
    case LoopId:
      Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
      ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                  *)&(self->
                     super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>_>
                     ).
                     super_LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                 ,Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                  ::doVisitLoop,currp);
      if (pEVar2->_id != LoopId) {
        __function = "T *wasm::Expression::cast() [T = wasm::Loop]";
        break;
      }
      pcVar5 = scan;
      pEVar3 = pEVar2 + 2;
LAB_0066876d:
      Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
      ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                  *)&(self->
                     super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>_>
                     ).
                     super_LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                 ,pcVar5,(Expression **)pEVar3);
      pcVar5 = ModAsyncify<true,_false,_true>::doNoteNonLinear;
      goto LAB_0066877f;
    case BreakId:
      pLVar4 = &(self->
                super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>_>
                ).
                super_LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
      ;
      Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
      ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                  *)pLVar4,
                 Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                 ::doVisitBreak,currp);
      Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
      ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                  *)pLVar4,ModAsyncify<true,_false,_true>::doNoteNonLinear,currp);
      if (pEVar2->_id == BreakId) {
        local_38 = (Expression *)&pEVar2[2].type;
        local_40 = scan;
        if ((pEVar2[2].type.id == 0) ||
           (SmallVector<wasm::Walker<wasm::ModAsyncify<true,false,true>,wasm::Visitor<wasm::ModAsyncify<true,false,true>,void>>::Task,10ul>
            ::
            emplace_back<void(*&)(wasm::ModAsyncify<true,false,true>*,wasm::Expression**),wasm::Expression**&>
                      ((SmallVector<wasm::Walker<wasm::ModAsyncify<true,false,true>,wasm::Visitor<wasm::ModAsyncify<true,false,true>,void>>::Task,10ul>
                        *)&(self->
                           super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>_>
                           ).
                           super_LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                           .
                           super_PostWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                           .
                           super_Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                           .stack,&local_40,(Expression ***)&local_38), pEVar2->_id == BreakId)) {
          local_38 = pEVar2 + 2;
          lVar8 = *(long *)(pEVar2 + 2);
          goto joined_r0x006687f5;
        }
      }
      __function = "T *wasm::Expression::cast() [T = wasm::Break]";
      break;
    case SwitchId:
      pLVar4 = &(self->
                super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>_>
                ).
                super_LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
      ;
      Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
      ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                  *)pLVar4,
                 Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                 ::doVisitSwitch,currp);
      Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
      ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                  *)pLVar4,ModAsyncify<true,_false,_true>::doNoteNonLinear,currp);
      if ((pEVar2->_id == SwitchId) &&
         (Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
          ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                      *)pLVar4,scan,(Expression **)&pEVar2[4].type), pEVar2->_id == SwitchId)) {
        local_38 = pEVar2 + 4;
        lVar8 = *(long *)(pEVar2 + 4);
joined_r0x006687f5:
        if (lVar8 != 0) {
          local_40 = scan;
          SmallVector<wasm::Walker<wasm::ModAsyncify<true,false,true>,wasm::Visitor<wasm::ModAsyncify<true,false,true>,void>>::Task,10ul>
          ::
          emplace_back<void(*&)(wasm::ModAsyncify<true,false,true>*,wasm::Expression**),wasm::Expression**&>
                    ((SmallVector<wasm::Walker<wasm::ModAsyncify<true,false,true>,wasm::Visitor<wasm::ModAsyncify<true,false,true>,void>>::Task,10ul>
                      *)&(self->
                         super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>_>
                         ).
                         super_LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                         .
                         super_PostWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                         .
                         super_Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                         .stack,&local_40,(Expression ***)&local_38);
        }
        return;
      }
      __function = "T *wasm::Expression::cast() [T = wasm::Switch]";
      break;
    default:
switchD_00668461_default:
      PostWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
      ::scan(self,currp);
      return;
    }
    goto LAB_006689ae;
  }
  pEVar3 = (Expression *)currp;
  if ((int)IVar1 < 0x32) {
    if (IVar1 == ReturnId) {
      pLVar4 = &(self->
                super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>_>
                ).
                super_LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
      ;
      Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
      ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                  *)pLVar4,
                 Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                 ::doVisitReturn,currp);
      Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
      ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                  *)pLVar4,ModAsyncify<true,_false,_true>::doNoteNonLinear,currp);
      if (pEVar2->_id == ReturnId) {
        local_38 = pEVar2 + 1;
        lVar8 = *(long *)(pEVar2 + 1);
        goto joined_r0x006687f5;
      }
      __function = "T *wasm::Expression::cast() [T = wasm::Return]";
      goto LAB_006689ae;
    }
    if (IVar1 == UnreachableId) {
      pcVar5 = Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
               ::doVisitUnreachable;
      goto LAB_0066876d;
    }
    if (IVar1 != TryId) goto switchD_00668461_default;
    pLVar4 = &(self->
              super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>_>
              ).
              super_LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
    ;
    Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                *)pLVar4,
               Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
               ::doVisitTry,currp);
    Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                *)pLVar4,ModAsyncify<true,_false,_true>::doNoteNonLinear,currp);
    if (pEVar2->_id != TryId) {
LAB_00668925:
      __function = "T *wasm::Expression::cast() [T = wasm::Try]";
LAB_006689ae:
      __assert_fail("int(_id) == int(T::SpecificId)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm.h"
                    ,0x314,__function);
    }
    if (0 < (int)(uint)*(undefined8 *)(pEVar2 + 5)) {
      uVar7 = (ulong)((uint)*(undefined8 *)(pEVar2 + 5) & 0x7fffffff);
      lVar8 = uVar7 * 8;
      uVar7 = uVar7 + 1;
      do {
        lVar8 = lVar8 + -8;
        if (*(ulong *)(pEVar2 + 5) <= uVar7 - 2) goto LAB_0066889e;
        Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
        ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                    *)pLVar4,scan,(Expression **)(pEVar2[4].type.id + lVar8));
        Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
        ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                    *)pLVar4,ModAsyncify<true,_false,_true>::doNoteNonLinear,currp);
        uVar7 = uVar7 - 1;
      } while (1 < uVar7);
      if (pEVar2->_id != TryId) goto LAB_00668925;
    }
    currp = (Expression **)(pEVar2 + 2);
  }
  else {
    if (IVar1 == ThrowId) {
      pLVar4 = &(self->
                super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>_>
                ).
                super_LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
      ;
      Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
      ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                  *)pLVar4,
                 Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                 ::doVisitThrow,currp);
      Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
      ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                  *)pLVar4,ModAsyncify<true,_false,_true>::doNoteNonLinear,currp);
      if (pEVar2->_id == ThrowId) {
        uVar6 = (uint)pEVar2[2].type.id;
        if ((int)uVar6 < 1) {
          return;
        }
        uVar7 = (ulong)(uVar6 & 0x7fffffff);
        lVar8 = uVar7 * 8;
        uVar7 = uVar7 + 1;
        while (lVar8 = lVar8 + -8, uVar7 - 2 < pEVar2[2].type.id) {
          Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
          ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                      *)pLVar4,scan,(Expression **)(*(long *)(pEVar2 + 2) + lVar8));
          uVar7 = uVar7 - 1;
          if (uVar7 < 2) {
            return;
          }
        }
        goto LAB_0066889e;
      }
      __function = "T *wasm::Expression::cast() [T = wasm::Throw]";
      goto LAB_006689ae;
    }
    if (IVar1 == RethrowId) {
      pcVar5 = Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
               ::doVisitRethrow;
      goto LAB_0066876d;
    }
    if (IVar1 != BrOnId) goto switchD_00668461_default;
    pLVar4 = &(self->
              super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>_>
              ).
              super_LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
    ;
    Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                *)pLVar4,
               Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
               ::doVisitBrOn,currp);
    Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
    ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
                *)pLVar4,ModAsyncify<true,_false,_true>::doNoteNonLinear,currp);
    if (pEVar2->_id != BrOnId) {
      __function = "T *wasm::Expression::cast() [T = wasm::BrOn]";
      goto LAB_006689ae;
    }
    currp = (Expression **)&pEVar2[2].type;
  }
  pcVar5 = scan;
LAB_0066877f:
  Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
  ::pushTask((Walker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
              *)&(self->
                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>_>
                 ).
                 super_LinearExecutionWalker<wasm::ModAsyncify<true,_false,_true>,_wasm::Visitor<wasm::ModAsyncify<true,_false,_true>,_void>_>
             ,pcVar5,currp);
  return;
}

Assistant:

static void scan(SubType* self, Expression** currp) {
    Expression* curr = *currp;

    switch (curr->_id) {
      case Expression::Id::InvalidId:
        WASM_UNREACHABLE("bad id");
      case Expression::Id::BlockId: {
        self->pushTask(SubType::doVisitBlock, currp);
        if (curr->cast<Block>()->name.is()) {
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        auto& list = curr->cast<Block>()->list;
        for (int i = int(list.size()) - 1; i >= 0; i--) {
          self->pushTask(SubType::scan, &list[i]);
        }
        break;
      }
      case Expression::Id::IfId: {
        self->pushTask(SubType::doVisitIf, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->maybePushTask(SubType::scan, &curr->cast<If>()->ifFalse);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->pushTask(SubType::scan, &curr->cast<If>()->ifTrue);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->pushTask(SubType::scan, &curr->cast<If>()->condition);
        break;
      }
      case Expression::Id::LoopId: {
        self->pushTask(SubType::doVisitLoop, currp);
        self->pushTask(SubType::scan, &curr->cast<Loop>()->body);
        self->pushTask(SubType::doNoteNonLinear, currp);
        break;
      }
      case Expression::Id::BreakId: {
        self->pushTask(SubType::doVisitBreak, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->maybePushTask(SubType::scan, &curr->cast<Break>()->condition);
        self->maybePushTask(SubType::scan, &curr->cast<Break>()->value);
        break;
      }
      case Expression::Id::SwitchId: {
        self->pushTask(SubType::doVisitSwitch, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->pushTask(SubType::scan, &curr->cast<Switch>()->condition);
        self->maybePushTask(SubType::scan, &curr->cast<Switch>()->value);
        break;
      }
      case Expression::Id::ReturnId: {
        self->pushTask(SubType::doVisitReturn, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->maybePushTask(SubType::scan, &curr->cast<Return>()->value);
        break;
      }
      case Expression::Id::TryId: {
        self->pushTask(SubType::doVisitTry, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        auto& list = curr->cast<Try>()->catchBodies;
        for (int i = int(list.size()) - 1; i >= 0; i--) {
          self->pushTask(SubType::scan, &list[i]);
          self->pushTask(SubType::doNoteNonLinear, currp);
        }
        self->pushTask(SubType::scan, &curr->cast<Try>()->body);
        break;
      }
      case Expression::Id::ThrowId: {
        self->pushTask(SubType::doVisitThrow, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        auto& list = curr->cast<Throw>()->operands;
        for (int i = int(list.size()) - 1; i >= 0; i--) {
          self->pushTask(SubType::scan, &list[i]);
        }
        break;
      }
      case Expression::Id::RethrowId: {
        self->pushTask(SubType::doVisitRethrow, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        break;
      }
      case Expression::Id::UnreachableId: {
        self->pushTask(SubType::doVisitUnreachable, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        break;
      }
      case Expression::Id::BrOnId: {
        self->pushTask(SubType::doVisitBrOn, currp);
        self->pushTask(SubType::doNoteNonLinear, currp);
        self->pushTask(SubType::scan, &curr->cast<BrOn>()->ref);
        break;
      }
      default: {
        // All relevant things should have been handled.
        assert(!Properties::isControlFlowStructure(curr));
        assert(!Properties::isBranch(curr));
        // other node types do not have control flow, use regular post-order
        PostWalker<SubType, VisitorType>::scan(self, currp);
      }
    }
  }